

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

int main(void)

{
  int iVar1;
  istream *this;
  ostream *poVar2;
  int local_64;
  int local_60;
  int x_1;
  int i_1;
  int x;
  int i;
  undefined1 local_48 [8];
  stack<int> b;
  stack<int> a;
  int local_10;
  int m;
  int n;
  
  m = 0;
  std::ios_base::sync_with_stdio(false);
  std::ios::tie((ostream *)((long)&std::cin + *(long *)(std::cin + -0x18)));
  CP::stack<int>::stack((stack<int> *)&b.mSize);
  CP::stack<int>::stack((stack<int> *)local_48);
  this = (istream *)std::istream::operator>>((istream *)&std::cin,&local_10);
  std::istream::operator>>(this,(int *)((long)&a.mSize + 4));
  for (i_1 = 0; i_1 < local_10; i_1 = i_1 + 1) {
    std::istream::operator>>((istream *)&std::cin,&x_1);
    CP::stack<int>::push((stack<int> *)&b.mSize,&x_1);
  }
  for (local_60 = 0; local_60 < a.mSize._4_4_; local_60 = local_60 + 1) {
    std::istream::operator>>((istream *)&std::cin,&local_64);
    CP::stack<int>::push((stack<int> *)local_48,&local_64);
  }
  poVar2 = std::operator<<((ostream *)&std::cout,"a.compare_reserve(b) = ");
  iVar1 = CP::stack<int>::compare_reserve((stack<int> *)&b.mSize,(stack<int> *)local_48);
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,iVar1);
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  poVar2 = std::operator<<((ostream *)&std::cout,"b.compare_reserve(a) = ");
  iVar1 = CP::stack<int>::compare_reserve((stack<int> *)local_48,(stack<int> *)&b.mSize);
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,iVar1);
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  CP::stack<int>::~stack((stack<int> *)local_48);
  CP::stack<int>::~stack((stack<int> *)&b.mSize);
  return m;
}

Assistant:

int main()
{
    std::ios_base::sync_with_stdio(false);std::cin.tie(0);

    int n,m;
    CP::stack<int> a,b;
    std::cin >> n >> m;
    for (int i = 0;i < n;i++) {
        int x;
        std::cin >> x;
        a.push(x);
    }
    for (int i = 0;i < m;i++) {
        int x;
        std::cin >> x;
        b.push(x);
    }
    std::cout << "a.compare_reserve(b) = " << a.compare_reserve(b) << std::endl;
    std::cout << "b.compare_reserve(a) = " << b.compare_reserve(a) << std::endl;
}